

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesDecoder::
DecodePoints<2,draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (KdTreeAttributesDecoder *this,int total_dimensionality,int num_expected_points,
          DecoderBuffer *in_buffer,PointAttributeVectorOutputIterator<unsigned_int> *out_iterator)

{
  bool bVar1;
  uint32_t in_EDX;
  DynamicIntegerPointsKdTreeDecoder<2> decoder;
  undefined4 in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffeb4;
  PointAttributeVectorOutputIterator<unsigned_int> *oit;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  PointAttributeVectorOutputIterator<unsigned_int> local_128 [3];
  uint32_t in_stack_ffffffffffffffac;
  DynamicIntegerPointsKdTreeDecoder<2> *in_stack_ffffffffffffffb0;
  bool local_1;
  
  oit = local_128;
  DynamicIntegerPointsKdTreeDecoder<2>::DynamicIntegerPointsKdTreeDecoder
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  bVar1 = DynamicIntegerPointsKdTreeDecoder<2>::
          DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                    ((DynamicIntegerPointsKdTreeDecoder<2> *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (DecoderBuffer *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                     oit,in_stack_fffffffffffffeb4);
  if ((bVar1) &&
     (in_stack_fffffffffffffeb4 =
           DynamicIntegerPointsKdTreeDecoder<2>::num_decoded_points
                     ((DynamicIntegerPointsKdTreeDecoder<2> *)local_128),
     in_stack_fffffffffffffeb4 == in_EDX)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  DynamicIntegerPointsKdTreeDecoder<2>::~DynamicIntegerPointsKdTreeDecoder
            ((DynamicIntegerPointsKdTreeDecoder<2> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return local_1;
}

Assistant:

bool KdTreeAttributesDecoder::DecodePoints(int total_dimensionality,
                                           int num_expected_points,
                                           DecoderBuffer *in_buffer,
                                           OutIteratorT *out_iterator) {
  DynamicIntegerPointsKdTreeDecoder<level_t> decoder(total_dimensionality);
  if (!decoder.DecodePoints(in_buffer, *out_iterator, num_expected_points) ||
      decoder.num_decoded_points() != num_expected_points) {
    return false;
  }
  return true;
}